

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_impl.c
# Opt level: O2

int log_impl_write(log_impl impl,log_record_ctor record_ctor)

{
  log_aspect aspect;
  int iVar1;
  undefined8 *puVar2;
  
  aspect = impl->aspects[3];
  puVar2 = (undefined8 *)log_aspect_derived(aspect);
  iVar1 = (*(code *)*puVar2)(aspect,record_ctor);
  return (int)(iVar1 != 0);
}

Assistant:

int log_impl_write(log_impl impl, const log_record_ctor record_ctor)
{
	log_aspect stream = log_impl_aspect(impl, LOG_ASPECT_STREAM);

	log_aspect_stream_impl stream_impl = log_aspect_derived(stream);

	int result = stream_impl->write(stream, record_ctor);

#if defined(__ADDRESS_SANITIZER__) || defined(__THREAD_SANITIZER__) || defined(__MEMORY_SANITIZER__)
	if (record_ctor->level >= LOG_LEVEL_WARNING /* TODO: Also check if stream is stdout */)
	{
		__sanitizer_print_stack_trace();
	}
#endif

	if (result != 0)
	{
		return 1;
	}

	return 0;
}